

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
slang::CommandLine::add
          (CommandLine *this,string_view name,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *value,string_view desc,
          string_view valueName,bitmask<slang::CommandLineFlags> flags)

{
  _Variadic_union<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_30;
  undefined1 local_10;
  
  local_10 = 10;
  local_30._M_first._M_storage = (_Uninitialized<std::optional<bool>_*,_true>)value;
  addInternal(this,name,(OptionStorage *)&local_30._M_first,desc,valueName,flags);
  std::__detail::__variant::
  _Variant_storage<false,_std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::~_Variant_storage((_Variant_storage<false,_std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                       *)&local_30._M_first);
  return;
}

Assistant:

void CommandLine::add(std::string_view name, std::vector<uint64_t>& value, std::string_view desc,
                      std::string_view valueName, bitmask<CommandLineFlags> flags) {
    addInternal(name, &value, desc, valueName, flags);
}